

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

int av1_hash_is_horizontal_perfect
              (YV12_BUFFER_CONFIG *picture,int block_size,int x_start,int y_start)

{
  uint8_t *puVar1;
  short *psVar2;
  uint8_t *puVar3;
  short *psVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int j;
  ulong uVar8;
  
  lVar7 = (long)(picture->field_4).field_0.y_stride;
  puVar3 = (picture->field_5).buffers[0] + (long)x_start + y_start * lVar7;
  if ((picture->flags & 8) == 0) {
    iVar5 = 0;
    iVar6 = 0;
    if (0 < block_size) {
      iVar6 = block_size;
    }
    for (; uVar8 = 1, iVar5 != iVar6; iVar5 = iVar5 + 1) {
      while ((uint)block_size != uVar8) {
        puVar1 = puVar3 + uVar8;
        uVar8 = uVar8 + 1;
        if (*puVar1 != *puVar3) {
          return 0;
        }
      }
      puVar3 = puVar3 + lVar7;
    }
  }
  else {
    psVar4 = (short *)((long)puVar3 * 2);
    iVar5 = 0;
    iVar6 = 0;
    if (0 < block_size) {
      iVar6 = block_size;
    }
    for (; uVar8 = 1, iVar5 != iVar6; iVar5 = iVar5 + 1) {
      while ((uint)block_size != uVar8) {
        psVar2 = psVar4 + uVar8;
        uVar8 = uVar8 + 1;
        if (*psVar2 != *psVar4) {
          return 0;
        }
      }
      psVar4 = psVar4 + lVar7;
    }
  }
  return 1;
}

Assistant:

int av1_hash_is_horizontal_perfect(const YV12_BUFFER_CONFIG *picture,
                                   int block_size, int x_start, int y_start) {
  const int stride = picture->y_stride;
  const uint8_t *p = picture->y_buffer + y_start * stride + x_start;

  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *p16 = CONVERT_TO_SHORTPTR(p);
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p16[j] != p16[0]) {
          return 0;
        }
      }
      p16 += stride;
    }
  } else {
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p[j] != p[0]) {
          return 0;
        }
      }
      p += stride;
    }
  }

  return 1;
}